

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sniff_csv.cpp
# Opt level: O3

void duckdb::CSVSniffFunction(ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  FunctionData *pFVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer pcVar2;
  undefined8 *puVar3;
  char **ppcVar4;
  undefined8 uVar5;
  CSVReaderOptions *this_00;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  bool bVar8;
  uint value;
  int iVar9;
  FileSystem *this_01;
  CSVStateMachineCache *state_machine_cache_p;
  reference pvVar10;
  reference pvVar11;
  ostream *poVar12;
  mapped_type *pmVar13;
  reference pvVar14;
  NotImplementedException *this_02;
  char opt;
  char opt_00;
  char opt_01;
  size_type __n;
  Value *this_03;
  LogicalType *type;
  pointer pLVar15;
  long lVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
  __l;
  string separator;
  string str_opt;
  SnifferResult sniffer_result;
  vector<duckdb::Value,_true> values;
  string new_line_identifier;
  vector<duckdb::OpenFileInfo,_true> files;
  ostringstream csv_read;
  ostringstream columns;
  StrpTimeFormat timestamp_format;
  StrpTimeFormat date_format;
  Value has_header;
  CSVReaderOptions sniffer_options;
  CSVSniffer sniffer;
  char *local_e80;
  long local_e78;
  char local_e70 [16];
  FunctionData *local_e60;
  Value local_e58;
  undefined1 *local_e18;
  long local_e10;
  undefined1 local_e08 [16];
  undefined1 local_df8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_de0;
  shared_ptr<duckdb::CSVBufferManager,_true> local_dc8;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_db8;
  GlobalTableFunctionState *local_d98;
  CSVReaderOptions *local_d90;
  string local_d88;
  string local_d68;
  vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> local_d48;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  local_d30;
  undefined1 local_cd0 [32];
  Value local_cb0 [3];
  LogicalType local_bb8;
  vector<duckdb::Value,_true> local_ba0;
  string local_b88;
  string local_b68;
  string local_b48;
  string local_b28;
  string local_b08;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  Value local_a88;
  ios_base local_a18 [264];
  undefined1 local_910 [8];
  _Alloc_hider local_908;
  pointer local_900;
  undefined1 local_8f8 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8d0 [24];
  undefined1 local_8b8 [32];
  undefined4 local_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  string local_880;
  string local_860;
  undefined1 local_840 [8];
  _Alloc_hider local_838;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_830;
  undefined1 local_828 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_800 [24];
  idx_t local_7e8;
  vector<int,_std::allocator<int>_> local_7e0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_7c8;
  Value local_7b0;
  MultiFileOptions local_770;
  undefined1 local_6d8 [40];
  CSVOption<char> local_6b0;
  CSVOption<char> local_6ae;
  CSVOption<char> local_6ac;
  bool local_6aa;
  bool local_698;
  bool local_697;
  map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  local_690;
  bool local_660;
  unsigned_long local_658;
  pointer local_588;
  pointer local_580;
  pointer local_570;
  pointer local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468 [12];
  CSVSniffer local_2d0;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  local_d98 = (data_p->global_state).ptr;
  if (*(char *)&local_d98[1]._vptr_GlobalTableFunctionState != '\0') {
    return;
  }
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&data_p->bind_data);
  pFVar1 = (data_p->bind_data).ptr;
  this_01 = FileSystem::GetFileSystem(context);
  FileSystem::GlobFiles
            ((vector<duckdb::OpenFileInfo,_true> *)&local_d48,this_01,(string *)(pFVar1 + 4),context
             ,DISALLOW_EMPTY);
  if (1 < (ulong)(((long)local_d48.
                         super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_d48.
                         super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555)) {
    this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_6d8._0_8_ = local_6d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6d8,"sniff_csv does not operate on more than one file yet","");
    NotImplementedException::NotImplementedException(this_02,(string *)local_6d8);
    __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_d90 = (CSVReaderOptions *)(pFVar1 + 8);
  local_e60 = pFVar1;
  CSVReaderOptions::CSVReaderOptions((CSVReaderOptions *)local_6d8,local_d90);
  vector<duckdb::OpenFileInfo,_true>::operator[]((vector<duckdb::OpenFileInfo,_true> *)&local_d48,0)
  ;
  ::std::__cxx11::string::_M_assign((string *)local_468);
  local_a88.type_._0_8_ = (ulong)(uint)local_a88.type_._4_4_ << 0x20;
  local_2d0._0_8_ = (CSVBufferManager *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVBufferManager,std::allocator<duckdb::CSVBufferManager>,duckdb::ClientContext&,duckdb::CSVReaderOptions&,std::__cxx11::string&,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2d0.line_error,
             (CSVBufferManager **)&local_2d0,(allocator<duckdb::CSVBufferManager> *)&local_d30,
             context,(CSVReaderOptions *)local_6d8,local_468,(int *)&local_a88);
  uVar5 = local_2d0._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2d0.line_error.error_message._M_dataplus._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_2d0.line_error.error_message._M_dataplus._M_p + 8) =
           *(int *)(local_2d0.line_error.error_message._M_dataplus._M_p + 8) + 1;
      UNLOCK();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_2d0.line_error.error_message._M_dataplus._M_p ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0153b019;
    }
    else {
      *(int *)(local_2d0.line_error.error_message._M_dataplus._M_p + 8) =
           *(int *)(local_2d0.line_error.error_message._M_dataplus._M_p + 8) + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2d0.line_error.error_message._M_dataplus._M_p);
  }
LAB_0153b019:
  if (local_570 == local_568) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_570,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_e60 + 0x8c));
  }
  if (local_588 == local_580) {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_588,
               (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               (local_e60 + 0x89));
  }
  local_770.hive_types_schema._M_h._M_buckets = &local_770.hive_types_schema._M_h._M_single_bucket;
  local_770.filename = false;
  local_770.hive_partitioning = false;
  local_770.auto_detect_hive_partitioning = true;
  local_770.union_by_name = false;
  local_770.hive_types_autocast = true;
  local_770.mapping = BY_NAME;
  local_770.hive_types_schema._M_h._M_bucket_count = 1;
  local_770.hive_types_schema._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_770.hive_types_schema._M_h._M_element_count = 0;
  local_770.hive_types_schema._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_770.hive_types_schema._M_h._M_rehash_policy._M_next_resize = 0;
  local_770.hive_types_schema._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_770.filename_column._M_dataplus._M_p = (pointer)&local_770.filename_column.field_2;
  local_770.filename_column.field_2._M_allocated_capacity = 0x656d616e656c6966;
  local_770.filename_column._M_string_length = 8;
  local_770.filename_column.field_2._M_local_buf[8] = '\0';
  local_770.custom_options._M_h._M_buckets = &local_770.custom_options._M_h._M_single_bucket;
  local_770.custom_options._M_h._M_bucket_count = 1;
  local_770.custom_options._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_770.custom_options._M_h._M_element_count = 0;
  local_770.custom_options._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_770.custom_options._M_h._M_rehash_policy._M_next_resize = 0;
  local_770.custom_options._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_dc8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)uVar5;
  local_dc8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_2d0.line_error.error_message._M_dataplus._M_p;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2d0.line_error.error_message._M_dataplus._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_2d0.line_error.error_message._M_dataplus._M_p + 8) =
           *(int *)(local_2d0.line_error.error_message._M_dataplus._M_p + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_2d0.line_error.error_message._M_dataplus._M_p + 8) =
           *(int *)(local_2d0.line_error.error_message._M_dataplus._M_p + 8) + 1;
    }
  }
  state_machine_cache_p = CSVStateMachineCache::Get(context);
  CSVSniffer::CSVSniffer
            (&local_2d0,(CSVReaderOptions *)local_6d8,&local_770,&local_dc8,state_machine_cache_p,
             true);
  if (local_dc8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_dc8.internal.
               super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  CSVSniffer::SniffCSV
            ((SnifferResult *)local_df8,&local_2d0,*(bool *)&local_e60[0x8f]._vptr_FunctionData);
  bVar8 = CSVSniffer::EmptyOrOnlyHeader(&local_2d0);
  uVar5 = local_df8._8_8_;
  if ((bVar8) && (local_df8._0_8_ != local_df8._8_8_)) {
    pLVar15 = (pointer)local_df8._0_8_;
    do {
      LogicalType::LogicalType(&local_a88.type_,VARCHAR);
      _Var7._M_pi = local_a88.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar6 = local_a88.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pLVar15->id_ = local_a88.type_.id_;
      pLVar15->physical_type_ = local_a88.type_.physical_type_;
      uVar17 = *(undefined4 *)
                &(pLVar15->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar18 = *(undefined4 *)
                ((long)&(pLVar15->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      uVar19 = *(undefined4 *)
                &(pLVar15->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar20 = *(undefined4 *)
                ((long)&(pLVar15->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (pLVar15->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pLVar15->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_a88.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_a88.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (pLVar15->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (pLVar15->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
      (pLVar15->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var7._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_898 = uVar17;
        uStack_894 = uVar18;
        uStack_890 = uVar19;
        uStack_88c = uVar20;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        uVar17 = local_898;
        uVar18 = uStack_894;
        uVar19 = uStack_890;
        uVar20 = uStack_88c;
      }
      _Var7._M_pi = local_a88.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_a88.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)CONCAT44(uVar18,uVar17);
      local_a88.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = uVar20;
      local_a88.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = uVar19;
      if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
      }
      LogicalType::~LogicalType(&local_a88.type_);
      pLVar15 = pLVar15 + 1;
    } while (pLVar15 != (pointer)uVar5);
  }
  local_e18 = local_e08;
  local_e10 = 0;
  local_e08[0] = 0;
  local_e80 = local_e70;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e80,", ","");
  output->count = 1;
  puVar3 = &local_a88.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_a88.type_._0_8_ = puVar3;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a88,local_6d8._8_8_,(pointer)(local_6d8._8_8_ + local_6d8._16_8_));
  ::std::__cxx11::string::operator=((string *)&local_e18,(string *)&local_a88);
  if ((undefined8 *)local_a88.type_._0_8_ != puVar3) {
    operator_delete((void *)local_a88.type_._0_8_);
  }
  local_aa8._M_dataplus._M_p = (pointer)&local_aa8.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_aa8,local_e18,local_e18 + local_e10);
  Value::Value(&local_a88,&local_aa8);
  DataChunk::SetValue(output,0,0,&local_a88);
  Value::~Value(&local_a88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p);
  }
  CSVOption<char>::FormatValueInternal_abi_cxx11_((string *)&local_a88,&local_6b0,&local_6b0.value);
  ::std::__cxx11::string::operator=((string *)&local_e18,(string *)&local_a88);
  if ((undefined8 *)local_a88.type_._0_8_ != puVar3) {
    operator_delete((void *)local_a88.type_._0_8_);
  }
  local_ac8._M_dataplus._M_p = (pointer)&local_ac8.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_ac8,local_e18,local_e18 + local_e10);
  Value::Value(&local_a88,&local_ac8);
  DataChunk::SetValue(output,1,0,&local_a88);
  Value::~Value(&local_a88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p);
  }
  CSVOption<char>::FormatValueInternal_abi_cxx11_((string *)&local_a88,&local_6ae,&local_6ae.value);
  ::std::__cxx11::string::operator=((string *)&local_e18,(string *)&local_a88);
  if ((undefined8 *)local_a88.type_._0_8_ != puVar3) {
    operator_delete((void *)local_a88.type_._0_8_);
  }
  local_ae8._M_dataplus._M_p = (pointer)&local_ae8.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_ae8,local_e18,local_e18 + local_e10);
  Value::Value(&local_a88,&local_ae8);
  DataChunk::SetValue(output,2,0,&local_a88);
  Value::~Value(&local_a88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._M_dataplus._M_p != &local_ae8.field_2) {
    operator_delete(local_ae8._M_dataplus._M_p);
  }
  CSVReaderOptions::NewLineIdentifierToString_abi_cxx11_(&local_d88,(CSVReaderOptions *)local_6d8);
  local_b08._M_dataplus._M_p = (pointer)&local_b08.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b08,local_d88._M_dataplus._M_p,
             local_d88._M_dataplus._M_p + local_d88._M_string_length);
  Value::Value(&local_a88,&local_b08);
  DataChunk::SetValue(output,3,0,&local_a88);
  Value::~Value(&local_a88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
    operator_delete(local_b08._M_dataplus._M_p);
  }
  CSVOption<char>::FormatValueInternal_abi_cxx11_((string *)&local_a88,&local_6ac,&local_6ac.value);
  ::std::__cxx11::string::operator=((string *)&local_e18,(string *)&local_a88);
  if ((undefined8 *)local_a88.type_._0_8_ != puVar3) {
    operator_delete((void *)local_a88.type_._0_8_);
  }
  local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_b28,local_e18,local_e18 + local_e10);
  Value::Value(&local_a88,&local_b28);
  DataChunk::SetValue(output,4,0,&local_a88);
  Value::~Value(&local_a88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p);
  }
  value = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(local_658);
  Value::UINTEGER(&local_a88,value);
  DataChunk::SetValue(output,5,0,&local_a88);
  Value::~Value(&local_a88);
  Value::BOOLEAN(&local_7b0,local_697);
  DataChunk::SetValue(output,6,0,&local_7b0);
  local_db8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_db8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_db8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_a88);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_a88,"{",1);
  if (local_df8._8_8_ != local_df8._0_8_) {
    __n = 0;
    do {
      pvVar10 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[](&local_de0,__n);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
      ::
      pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_d30,(char (*) [5])0x1df8ca9,pvVar10);
      pvVar11 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)local_df8,__n);
      LogicalType::ToString_abi_cxx11_(&local_d68,pvVar11);
      Value::Value((Value *)local_840,&local_d68);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
      ::pair<const_char_(&)[5],_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                  *)local_cd0,(char (*) [5])0x1de9f3f,(Value *)local_840);
      __l._M_len = 2;
      __l._M_array = &local_d30;
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                *)local_910,__l,(allocator_type *)&local_e58);
      lVar16 = -0xc0;
      this_03 = local_cb0;
      do {
        Value::~Value(this_03);
        if (&this_03[-1].value_info_ !=
            (shared_ptr<duckdb::ExtraValueInfo,_true> *)this_03[-1].value_.bigint) {
          operator_delete((undefined1 *)this_03[-1].value_.bigint);
        }
        this_03 = (Value *)&this_03[-2].value_;
        lVar16 = lVar16 + 0x60;
      } while (lVar16 != 0);
      Value::~Value((Value *)local_840);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d68._M_dataplus._M_p != &local_d68.field_2) {
        operator_delete(local_d68._M_dataplus._M_p);
      }
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::vector(&local_7c8,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                *)local_910);
      Value::STRUCT((Value *)&local_d30,(child_list_t<Value> *)&local_7c8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_db8,
                 (Value *)&local_d30);
      Value::~Value((Value *)&local_d30);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector(&local_7c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_a88,"\'",1);
      pvVar10 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[](&local_de0,__n);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_a88,(pvVar10->_M_dataplus)._M_p,
                           pvVar10->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\': \'",4);
      pvVar11 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)local_df8,__n);
      LogicalType::ToString_abi_cxx11_(&local_d30.first,pvVar11);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,local_d30.first._M_dataplus._M_p,local_d30.first._M_string_length
                          );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d30.first._M_dataplus._M_p != &local_d30.first.field_2) {
        operator_delete(local_d30.first._M_dataplus._M_p);
      }
      if (__n != ((long)(local_df8._8_8_ - local_df8._0_8_) >> 3) * -0x5555555555555555 - 1U) {
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_a88,local_e80,local_e78);
      }
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 *)local_910);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(local_df8._8_8_ - local_df8._0_8_) >> 3) * -0x5555555555555555));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_a88,"}",1);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ba0,&local_db8);
  Value::LIST((Value *)&local_d30,&local_ba0);
  DataChunk::SetValue(output,7,0,(Value *)&local_d30);
  Value::~Value((Value *)&local_d30);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ba0);
  pmVar13 = ::std::
            map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
            ::operator[](&local_690,&LogicalType::DATE);
  local_840 = (undefined1  [8])&PTR__StrTimeFormat_02459560;
  local_838._M_p = local_828;
  pcVar2 = (pmVar13->value).super_StrTimeFormat.format_specifier._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_838,pcVar2,
             pcVar2 + (pmVar13->value).super_StrTimeFormat.format_specifier._M_string_length);
  ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::vector
            ((vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_> *)
             (local_828 + 0x10),
             &(pmVar13->value).super_StrTimeFormat.specifiers.
              super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_800,
           &(pmVar13->value).super_StrTimeFormat.literals.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_7e8 = (pmVar13->value).super_StrTimeFormat.constant_size;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_7e0,
             &(pmVar13->value).super_StrTimeFormat.numeric_width.
              super_vector<int,_std::allocator<int>_>);
  local_840 = (undefined1  [8])&PTR__StrTimeFormat_024595d8;
  bVar8 = StrTimeFormat::Empty((StrTimeFormat *)local_840);
  uVar5 = local_df8._8_8_;
  if (bVar8) {
    if (local_df8._0_8_ == local_df8._8_8_) {
LAB_0153bb5c:
      Value::Value((Value *)&local_d30,(nullptr_t)0x0);
      DataChunk::SetValue(output,8,0,(Value *)&local_d30);
      Value::~Value((Value *)&local_d30);
    }
    else {
      bVar8 = false;
      pLVar15 = (pointer)local_df8._0_8_;
      do {
        while (pLVar15->id_ != DATE) {
          pLVar15 = pLVar15 + 1;
          if (pLVar15 == (pointer)uVar5) {
            if (!bVar8) goto LAB_0153bb5c;
            goto LAB_0153bb91;
          }
        }
        Value::Value((Value *)&local_d30,"%Y-%m-%d");
        DataChunk::SetValue(output,8,0,(Value *)&local_d30);
        Value::~Value((Value *)&local_d30);
        pLVar15 = pLVar15 + 1;
        bVar8 = true;
      } while (pLVar15 != (pointer)uVar5);
    }
  }
  else {
    local_b48._M_dataplus._M_p = (pointer)&local_b48.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b48,local_838._M_p,
               local_838._M_p + (long)&(local_830._M_pi)->_vptr__Sp_counted_base);
    Value::Value((Value *)&local_d30,&local_b48);
    DataChunk::SetValue(output,8,0,(Value *)&local_d30);
    Value::~Value((Value *)&local_d30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b48._M_dataplus._M_p != &local_b48.field_2) {
      operator_delete(local_b48._M_dataplus._M_p);
    }
  }
LAB_0153bb91:
  pmVar13 = ::std::
            map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
            ::operator[](&local_690,&LogicalType::TIMESTAMP);
  local_910 = (undefined1  [8])&PTR__StrTimeFormat_02459560;
  local_908._M_p = local_8f8;
  pcVar2 = (pmVar13->value).super_StrTimeFormat.format_specifier._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_908,pcVar2,
             pcVar2 + (pmVar13->value).super_StrTimeFormat.format_specifier._M_string_length);
  ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::vector
            ((vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_> *)
             (local_8f8 + 0x10),
             &(pmVar13->value).super_StrTimeFormat.specifiers.
              super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>);
  this_00 = local_d90;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_8d0,
           &(pmVar13->value).super_StrTimeFormat.literals.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_8b8._0_8_ = (pmVar13->value).super_StrTimeFormat.constant_size;
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_8b8 + 8),
             &(pmVar13->value).super_StrTimeFormat.numeric_width.
              super_vector<int,_std::allocator<int>_>);
  local_910 = (undefined1  [8])&PTR__StrTimeFormat_024595d8;
  bVar8 = StrTimeFormat::Empty((StrTimeFormat *)local_910);
  if (bVar8) {
    Value::Value((Value *)&local_d30,(nullptr_t)0x0);
    DataChunk::SetValue(output,9,0,(Value *)&local_d30);
    Value::~Value((Value *)&local_d30);
  }
  else {
    local_b68._M_dataplus._M_p = (pointer)&local_b68.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b68,local_908._M_p,local_908._M_p + (long)&local_900->first);
    Value::Value((Value *)&local_d30,&local_b68);
    DataChunk::SetValue(output,9,0,(Value *)&local_d30);
    Value::~Value((Value *)&local_d30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b68._M_dataplus._M_p != &local_b68.field_2) {
      operator_delete(local_b68._M_dataplus._M_p);
    }
  }
  if (local_e60[0x6a]._vptr_FunctionData == (_func_int **)0x0) {
    LogicalType::LogicalType(&local_bb8,SQLNULL);
    Value::Value((Value *)&local_d30,&local_bb8);
    DataChunk::SetValue(output,10,0,(Value *)&local_d30);
    Value::~Value((Value *)&local_d30);
    LogicalType::~LogicalType(&local_bb8);
  }
  else {
    CSVReaderOptions::GetUserDefinedParameters_abi_cxx11_(&local_860,this_00);
    Value::Value((Value *)&local_d30,&local_860);
    DataChunk::SetValue(output,10,0,(Value *)&local_d30);
    Value::~Value((Value *)&local_d30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_860._M_dataplus._M_p != &local_860.field_2) {
      operator_delete(local_860._M_dataplus._M_p);
    }
  }
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_d30);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d30,"FROM read_csv(\'",0xf)
  ;
  pvVar14 = vector<duckdb::OpenFileInfo,_true>::operator[]
                      ((vector<duckdb::OpenFileInfo,_true> *)&local_d48,0);
  poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_d30,(pvVar14->path)._M_dataplus._M_p,
                       (pvVar14->path)._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
  poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_e80,local_e78);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"auto_detect=false",0x11);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_e80,local_e78);
  if (local_6d8[0] == (string)0x0) {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d30,"delim=",6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d30,"\'",1);
    local_b88._M_dataplus._M_p = (pointer)&local_b88.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b88,local_6d8._8_8_,(pointer)(local_6d8._8_8_ + local_6d8._16_8_));
    FormatOptions((string *)&local_e58,&local_b88);
    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_d30,(char *)local_e58.type_._0_8_,
                         (long)local_e58.type_.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_e80,local_e78);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_e58.type_._0_8_ !=
        &local_e58.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_e58.type_._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b88._M_dataplus._M_p != &local_b88.field_2) {
      operator_delete(local_b88._M_dataplus._M_p);
    }
  }
  if (local_6b0.set_by_user == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d30,"quote=",6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d30,"\'",1);
    FormatOptions_abi_cxx11_((string *)&local_e58,(duckdb *)(ulong)(uint)(int)local_6b0.value,opt);
    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_d30,(char *)local_e58.type_._0_8_,
                         (long)local_e58.type_.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_e80,local_e78);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_e58.type_._0_8_ !=
        &local_e58.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_e58.type_._0_8_);
    }
  }
  if (local_6ae.set_by_user == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d30,"escape=",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d30,"\'",1);
    FormatOptions_abi_cxx11_
              ((string *)&local_e58,(duckdb *)(ulong)(uint)(int)local_6ae.value,opt_00);
    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_d30,(char *)local_e58.type_._0_8_,
                         (long)local_e58.type_.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_e80,local_e78);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_e58.type_._0_8_ !=
        &local_e58.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_e58.type_._0_8_);
    }
  }
  if ((local_6aa == false) &&
     (iVar9 = ::std::__cxx11::string::compare((char *)&local_d88), iVar9 != 0)) {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d30,"new_line=",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d30,"\'",1);
    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_d30,local_d88._M_dataplus._M_p,local_d88._M_string_length
                        );
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_e80,local_e78);
  }
  if (local_660 == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d30,"skip=",5);
    poVar12 = ::std::ostream::_M_insert<unsigned_long>((ulong)&local_d30);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_e80,local_e78);
  }
  if (local_6ac.set_by_user == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d30,"comment=",8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d30,"\'",1);
    FormatOptions_abi_cxx11_
              ((string *)&local_e58,(duckdb *)(ulong)(uint)(int)local_6ac.value,opt_01);
    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_d30,(char *)local_e58.type_._0_8_,
                         (long)local_e58.type_.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_e80,local_e78);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_e58.type_._0_8_ !=
        &local_e58.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_e58.type_._0_8_);
    }
  }
  if (local_698 == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d30,"header=",7);
    poVar12 = operator<<((ostream *)&local_d30,&local_7b0);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_e80,local_e78);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d30,"columns=",8);
  ::std::__cxx11::stringbuf::str();
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_d30,(char *)local_e58.type_._0_8_,
             (long)local_e58.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  ppcVar4 = (char **)&local_e58.type_.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
  if ((char **)local_e58.type_._0_8_ != ppcVar4) {
    operator_delete((void *)local_e58.type_._0_8_);
  }
  pmVar13 = ::std::
            map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
            ::operator[](&local_690,&LogicalType::DATE);
  if (pmVar13->set_by_user == false) {
    pmVar13 = ::std::
              map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
              ::operator[](&local_690,&LogicalType::DATE);
    if ((pmVar13->value).super_StrTimeFormat.format_specifier._M_string_length == 0) {
      for (; local_df8._0_8_ != local_df8._8_8_; local_df8._0_8_ = local_df8._0_8_ + 0x18) {
        if (((pointer)local_df8._0_8_)->id_ == DATE) {
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_d30,local_e80,local_e78);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"dateformat=",0xb);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'%Y-%m-%d\'",10);
          break;
        }
      }
    }
    else {
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_d30,local_e80,local_e78);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"dateformat=",0xb);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
      pmVar13 = ::std::
                map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                ::operator[](&local_690,&LogicalType::DATE);
      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(pmVar13->value).super_StrTimeFormat.format_specifier._M_dataplus
                                   ._M_p,
                           (pmVar13->value).super_StrTimeFormat.format_specifier._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
    }
  }
  pmVar13 = ::std::
            map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
            ::operator[](&local_690,&LogicalType::TIMESTAMP);
  if ((pmVar13->set_by_user == false) &&
     (pmVar13 = ::std::
                map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                ::operator[](&local_690,&LogicalType::TIMESTAMP),
     (pmVar13->value).super_StrTimeFormat.format_specifier._M_string_length != 0)) {
    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_d30,local_e80,local_e78);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"timestampformat=",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
    pmVar13 = ::std::
              map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
              ::operator[](&local_690,&LogicalType::TIMESTAMP);
    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,(pmVar13->value).super_StrTimeFormat.format_specifier._M_dataplus.
                                 _M_p,
                         (pmVar13->value).super_StrTimeFormat.format_specifier._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
  }
  if (local_e60[0x6a]._vptr_FunctionData != (_func_int **)0x0) {
    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_d30,local_e80,local_e78);
    CSVReaderOptions::GetUserDefinedParameters_abi_cxx11_((string *)&local_e58,this_00);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,(char *)local_e58.type_._0_8_,
               (long)local_e58.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if ((char **)local_e58.type_._0_8_ != ppcVar4) {
      operator_delete((void *)local_e58.type_._0_8_);
    }
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d30,");",2);
  ::std::__cxx11::stringbuf::str();
  Value::Value(&local_e58,&local_880);
  DataChunk::SetValue(output,0xb,0,&local_e58);
  Value::~Value(&local_e58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880._M_dataplus._M_p != &local_880.field_2) {
    operator_delete(local_880._M_dataplus._M_p);
  }
  *(undefined1 *)&local_d98[1]._vptr_GlobalTableFunctionState = 1;
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_d30);
  ::std::ios_base::~ios_base((ios_base *)(local_cd0 + 0x10));
  StrTimeFormat::~StrTimeFormat((StrTimeFormat *)local_910);
  StrTimeFormat::~StrTimeFormat((StrTimeFormat *)local_840);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_a88);
  ::std::ios_base::~ios_base(local_a18);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_db8);
  Value::~Value(&local_7b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d88._M_dataplus._M_p != &local_d88.field_2) {
    operator_delete(local_d88._M_dataplus._M_p);
  }
  if (local_e80 != local_e70) {
    operator_delete(local_e80);
  }
  if (local_e18 != local_e08) {
    operator_delete(local_e18);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_de0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_df8);
  CSVSniffer::~CSVSniffer(&local_2d0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_770.custom_options._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770.filename_column._M_dataplus._M_p != &local_770.filename_column.field_2) {
    operator_delete(local_770.filename_column._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_770.hive_types_schema._M_h);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2d0.line_error.error_message._M_dataplus._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2d0.line_error.error_message._M_dataplus._M_p);
  }
  CSVReaderOptions::~CSVReaderOptions((CSVReaderOptions *)local_6d8);
  std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector(&local_d48);
  return;
}

Assistant:

static void CSVSniffFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &global_state = data_p.global_state->Cast<CSVSniffGlobalState>();
	// Are we done?
	if (global_state.done) {
		return;
	}
	const CSVSniffFunctionData &data = data_p.bind_data->Cast<CSVSniffFunctionData>();
	auto &fs = duckdb::FileSystem::GetFileSystem(context);

	auto files = fs.GlobFiles(data.path, context, FileGlobOptions::DISALLOW_EMPTY);
	if (files.size() > 1) {
		throw NotImplementedException("sniff_csv does not operate on more than one file yet");
	}

	// We must run the sniffer.
	auto sniffer_options = data.options;
	sniffer_options.file_path = files[0].path;

	auto buffer_manager = make_shared_ptr<CSVBufferManager>(context, sniffer_options, sniffer_options.file_path, 0);
	if (sniffer_options.name_list.empty()) {
		sniffer_options.name_list = data.names_csv;
	}

	if (sniffer_options.sql_type_list.empty()) {
		sniffer_options.sql_type_list = data.return_types_csv;
	}
	MultiFileOptions file_options;
	CSVSniffer sniffer(sniffer_options, file_options, buffer_manager, CSVStateMachineCache::Get(context));
	auto sniffer_result = sniffer.SniffCSV(data.force_match);
	if (sniffer.EmptyOrOnlyHeader()) {
		for (auto &type : sniffer_result.return_types) {
			D_ASSERT(type.id() == LogicalTypeId::BOOLEAN);
			// we default to varchar if all files are empty or only have a header after all the sniffing
			type = LogicalType::VARCHAR;
		}
	}
	string str_opt;
	string separator = ", ";
	// Set output
	output.SetCardinality(1);

	// 1. Delimiter
	str_opt = sniffer_options.dialect_options.state_machine_options.delimiter.FormatValue();
	output.SetValue(0, 0, str_opt);
	// 2. Quote
	str_opt = sniffer_options.dialect_options.state_machine_options.quote.FormatValue();
	output.SetValue(1, 0, str_opt);
	// 3. Escape
	str_opt = sniffer_options.dialect_options.state_machine_options.escape.FormatValue();
	output.SetValue(2, 0, str_opt);
	// 4. NewLine Delimiter
	auto new_line_identifier = sniffer_options.NewLineIdentifierToString();
	output.SetValue(3, 0, new_line_identifier);
	// 5. Comment
	str_opt = sniffer_options.dialect_options.state_machine_options.comment.FormatValue();
	output.SetValue(4, 0, str_opt);
	// 6. Skip Rows
	output.SetValue(5, 0, Value::UINTEGER(NumericCast<uint32_t>(sniffer_options.dialect_options.skip_rows.GetValue())));
	// 7. Has Header
	auto has_header = Value::BOOLEAN(sniffer_options.dialect_options.header.GetValue());
	output.SetValue(6, 0, has_header);
	// 8. List<Struct<Column-Name:Types>> {'col1': 'INTEGER', 'col2': 'VARCHAR'}
	vector<Value> values;
	std::ostringstream columns;
	columns << "{";
	for (idx_t i = 0; i < sniffer_result.return_types.size(); i++) {
		child_list_t<Value> struct_children {{"name", sniffer_result.names[i]},
		                                     {"type", {sniffer_result.return_types[i].ToString()}}};
		values.emplace_back(Value::STRUCT(struct_children));
		columns << "'" << sniffer_result.names[i] << "': '" << sniffer_result.return_types[i].ToString() << "'";
		if (i != sniffer_result.return_types.size() - 1) {
			columns << separator;
		}
	}
	columns << "}";
	output.SetValue(7, 0, Value::LIST(values));
	// 9. Date Format
	auto date_format = sniffer_options.dialect_options.date_format[LogicalType::DATE].GetValue();
	if (!date_format.Empty()) {
		output.SetValue(8, 0, date_format.format_specifier);
	} else {
		bool has_date = false;
		for (auto &c_type : sniffer_result.return_types) {
			// Must be ISO 8601
			if (c_type.id() == LogicalTypeId::DATE) {
				output.SetValue(8, 0, Value("%Y-%m-%d"));
				has_date = true;
			}
		}
		if (!has_date) {
			output.SetValue(8, 0, Value(nullptr));
		}
	}

	// 10. Timestamp Format
	auto timestamp_format = sniffer_options.dialect_options.date_format[LogicalType::TIMESTAMP].GetValue();
	if (!timestamp_format.Empty()) {
		output.SetValue(9, 0, timestamp_format.format_specifier);
	} else {
		output.SetValue(9, 0, Value(nullptr));
	}

	// 11. The Extra User Arguments
	if (data.options.user_defined_parameters.empty()) {
		output.SetValue(10, 0, Value());
	} else {
		output.SetValue(10, 0, Value(data.options.GetUserDefinedParameters()));
	}

	// 12. csv_read string
	std::ostringstream csv_read;

	// Base, Path and auto_detect=false
	csv_read << "FROM read_csv('" << files[0].path << "'" << separator << "auto_detect=false" << separator;
	// 10.1. Delimiter
	if (!sniffer_options.dialect_options.state_machine_options.delimiter.IsSetByUser()) {
		csv_read << "delim="
		         << "'" << FormatOptions(sniffer_options.dialect_options.state_machine_options.delimiter.GetValue())
		         << "'" << separator;
	}
	// 11.2. Quote
	if (!sniffer_options.dialect_options.state_machine_options.quote.IsSetByUser()) {
		csv_read << "quote="
		         << "'" << FormatOptions(sniffer_options.dialect_options.state_machine_options.quote.GetValue()) << "'"
		         << separator;
	}
	// 11.3. Escape
	if (!sniffer_options.dialect_options.state_machine_options.escape.IsSetByUser()) {
		csv_read << "escape="
		         << "'" << FormatOptions(sniffer_options.dialect_options.state_machine_options.escape.GetValue()) << "'"
		         << separator;
	}
	// 11.4. NewLine Delimiter
	if (!sniffer_options.dialect_options.state_machine_options.new_line.IsSetByUser()) {
		if (new_line_identifier != "mix") {
			csv_read << "new_line="
			         << "'" << new_line_identifier << "'" << separator;
		}
	}
	// 11.5. Skip Rows
	if (!sniffer_options.dialect_options.skip_rows.IsSetByUser()) {
		csv_read << "skip=" << sniffer_options.dialect_options.skip_rows.GetValue() << separator;
	}

	// 11.6. Comment
	if (!sniffer_options.dialect_options.state_machine_options.comment.IsSetByUser()) {
		csv_read << "comment="
		         << "'" << FormatOptions(sniffer_options.dialect_options.state_machine_options.comment.GetValue())
		         << "'" << separator;
	}

	// 11.7. Has Header
	if (!sniffer_options.dialect_options.header.IsSetByUser()) {
		csv_read << "header=" << has_header << separator;
	}
	// 11.8. column={'col1': 'INTEGER', 'col2': 'VARCHAR'}
	csv_read << "columns=" << columns.str();
	// 11.9. Date Format
	if (!sniffer_options.dialect_options.date_format[LogicalType::DATE].IsSetByUser()) {
		if (!sniffer_options.dialect_options.date_format[LogicalType::DATE].GetValue().format_specifier.empty()) {
			csv_read << separator << "dateformat="
			         << "'"
			         << sniffer_options.dialect_options.date_format[LogicalType::DATE].GetValue().format_specifier
			         << "'";
		} else {
			for (auto &c_type : sniffer_result.return_types) {
				// Must be ISO 8601
				if (c_type.id() == LogicalTypeId::DATE) {
					csv_read << separator << "dateformat="
					         << "'%Y-%m-%d'";
					break;
				}
			}
		}
	}
	// 11.10. Timestamp Format
	if (!sniffer_options.dialect_options.date_format[LogicalType::TIMESTAMP].IsSetByUser()) {
		if (!sniffer_options.dialect_options.date_format[LogicalType::TIMESTAMP].GetValue().format_specifier.empty()) {
			csv_read << separator << "timestampformat="
			         << "'"
			         << sniffer_options.dialect_options.date_format[LogicalType::TIMESTAMP].GetValue().format_specifier
			         << "'";
		}
	}
	// 11.11 User Arguments
	if (!data.options.user_defined_parameters.empty()) {
		csv_read << separator << data.options.GetUserDefinedParameters();
	}
	csv_read << ");";
	output.SetValue(11, 0, csv_read.str());
	global_state.done = true;
}